

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

void google::protobuf::internal::MapMergeFrom<long,proto2_unittest::Proto2MapEnum>
               (Map<long,_proto2_unittest::Proto2MapEnum> *dest,
               Map<long,_proto2_unittest::Proto2MapEnum> *src)

{
  undefined4 uVar1;
  uint uVar2;
  ulong uVar3;
  NodeBase *pNVar4;
  pair<google::protobuf::Map<long,_proto2_unittest::Proto2MapEnum>::iterator,_bool> local_50;
  
  uVar2 = (src->super_KeyMapBase<unsigned_long>).super_UntypedMapBase.index_of_first_non_null_;
  uVar3 = (ulong)uVar2;
  if (uVar2 == (src->super_KeyMapBase<unsigned_long>).super_UntypedMapBase.num_buckets_) {
    uVar3 = 0;
    pNVar4 = (NodeBase *)0x0;
  }
  else {
    pNVar4 = (src->super_KeyMapBase<unsigned_long>).super_UntypedMapBase.table_[uVar3];
    if (pNVar4 == (NodeBase *)0x0) {
      protobuf_assumption_failed
                ("node != nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
                 ,0x22e);
    }
  }
  if (pNVar4 != (NodeBase *)0x0) {
    do {
      uVar1 = *(undefined4 *)&pNVar4[2].next;
      Map<long,proto2_unittest::Proto2MapEnum>::TryEmplaceInternal<long_const&>
                (&local_50,dest,(long *)(pNVar4 + 1));
      *(undefined4 *)&local_50.first.super_UntypedMapIterator.node_[2].next = uVar1;
      pNVar4 = pNVar4->next;
      if (pNVar4 == (NodeBase *)0x0) {
        do {
          uVar2 = (int)uVar3 + 1;
          uVar3 = (ulong)uVar2;
          if ((src->super_KeyMapBase<unsigned_long>).super_UntypedMapBase.num_buckets_ <= uVar2) {
            pNVar4 = (NodeBase *)0x0;
            uVar3 = 0;
            break;
          }
          pNVar4 = (src->super_KeyMapBase<unsigned_long>).super_UntypedMapBase.table_[uVar2];
        } while (pNVar4 == (NodeBase *)0x0);
      }
    } while (pNVar4 != (NodeBase *)0x0);
  }
  return;
}

Assistant:

PROTOBUF_NOINLINE void MapMergeFrom(Map<T...>& dest, const Map<T...>& src) {
  for (const auto& elem : src) {
    dest[elem.first] = elem.second;
  }
}